

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O1

void duckdb::MedianAbsoluteDeviationOperation<short>::
     Finalize<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>>
               (QuantileState<short,_duckdb::QuantileStandardType> *state,short *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  short *v_t;
  short sVar2;
  reference pvVar3;
  idx_t iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  short med;
  MadAccessor<short,_short,_short> accessor;
  Interpolator<false> interp;
  short local_82;
  MadAccessor<short,_short,_short> local_80;
  double local_78;
  double dStack_70;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<short,_std::allocator<short>_>.
      super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pvVar3 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)((this->bind_data).ptr + 1),0);
    v_t = (state->v).super_vector<short,_std::allocator<short>_>.
          super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data._M_start
    ;
    iVar4 = (long)(state->v).super_vector<short,_std::allocator<short>_>.
                  super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)v_t >> 1;
    local_60.desc = false;
    lVar1 = iVar4 - 1;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    dStack_70 = auVar6._8_8_ - 1.9342813113834067e+25;
    local_78 = (dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar3->dbl;
    local_60.RN = local_78;
    dVar5 = floor(local_78);
    local_60.FRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    dVar5 = ceil(local_78);
    local_60.CRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    local_60.begin = 0;
    local_60.end = iVar4;
    local_82 = Interpolator<false>::Operation<short,short,duckdb::QuantileDirect<short>>
                         (&local_60,v_t,finalize_data->result,(QuantileDirect<short> *)&local_80);
    local_80.median = &local_82;
    sVar2 = Interpolator<false>::Operation<short,short,duckdb::MadAccessor<short,short,short>>
                      (&local_60,
                       (state->v).super_vector<short,_std::allocator<short>_>.
                       super__Vector_base<short,_std::allocator<short>_>._M_impl.
                       super__Vector_impl_data._M_start,finalize_data->result,&local_80);
    *target = sVar2;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		using INPUT_TYPE = typename STATE::InputType;
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &q = bind_data.quantiles[0];
		Interpolator<false> interp(q, state.v.size(), false);
		const auto med = interp.template Operation<INPUT_TYPE, MEDIAN_TYPE>(state.v.data(), finalize_data.result);

		MadAccessor<INPUT_TYPE, T, MEDIAN_TYPE> accessor(med);
		target = interp.template Operation<INPUT_TYPE, T>(state.v.data(), finalize_data.result, accessor);
	}